

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.hpp
# Opt level: O2

Task * __thiscall tf::Task::precede<tf::Task&,tf::Task&>(Task *this,Task *tasks,Task *tasks_1)

{
  Node::_precede(this->_node,tasks->_node);
  Node::_precede(this->_node,tasks_1->_node);
  return this;
}

Assistant:

Task& Task::precede(Ts&&... tasks) {
  (_node->_precede(tasks._node), ...);
  //_precede(std::forward<Ts>(tasks)...);
  return *this;
}